

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockIndex.h
# Opt level: O0

void __thiscall
adios2::query::BlockIndex<unsigned_char>::Evaluate
          (BlockIndex<unsigned_char> *this,QueryVar *query,
          vector<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_> *resultBlockIDs)

{
  undefined1 uVar1;
  runtime_error *this_00;
  undefined8 uVar2;
  void *pvVar3;
  long *in_RDI;
  size_t in_stack_00000010;
  VariableBase *in_stack_00000018;
  MinVarInfo *MinBlocksInfo;
  Dims currShape;
  size_t currStep;
  vector<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_> *in_stack_000000c8;
  MinVarInfo *in_stack_000000d0;
  QueryVar *in_stack_000000d8;
  BlockIndex<unsigned_char> *in_stack_000000e0;
  vector<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_> *in_stack_000000e8;
  size_t in_stack_000000f0;
  QueryVar *in_stack_000000f8;
  BlockIndex<unsigned_char> *in_stack_00000100;
  undefined7 in_stack_ffffffffffffff90;
  
  if (*in_RDI != 0) {
    uVar2 = (**(code **)(*(long *)in_RDI[2] + 0x20))();
    core::VariableBase::Shape(in_stack_00000018,in_stack_00000010);
    uVar1 = QueryVar::IsSelectionValid
                      ((QueryVar *)currStep,
                       (Dims *)currShape.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage);
    if ((bool)uVar1) {
      pvVar3 = (void *)(**(code **)(*(long *)in_RDI[2] + 0x58))((long *)in_RDI[2],*in_RDI,uVar2);
      if (pvVar3 == (void *)0x0) {
        RunStatBlocksInfo(in_stack_00000100,in_stack_000000f8,in_stack_000000f0,in_stack_000000e8);
      }
      else {
        RunStatMinBlocksInfo
                  (in_stack_000000e0,in_stack_000000d8,in_stack_000000d0,in_stack_000000c8);
        if (pvVar3 != (void *)0x0) {
          MinVarInfo::~MinVarInfo((MinVarInfo *)0xd2b2bc);
          operator_delete(pvVar3);
        }
      }
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               CONCAT17(uVar1,in_stack_ffffffffffffff90));
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Unable to evaluate query! Invalid Variable detected");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Evaluate(const QueryVar &query, std::vector<BlockHit> &resultBlockIDs)
    {
        if (nullptr == m_VarPtr)
        {
            throw std::runtime_error("Unable to evaluate query! Invalid Variable detected");
        }

        size_t currStep = m_IdxReader.CurrentStep();
        adios2::Dims currShape = m_VarPtr->Shape();
        if (!query.IsSelectionValid(currShape))
            return;

        auto MinBlocksInfo = m_IdxReader.MinBlocksInfo(*m_VarPtr, currStep);

        if (MinBlocksInfo != nullptr)
        {
            RunStatMinBlocksInfo(query, MinBlocksInfo, resultBlockIDs);
            delete MinBlocksInfo;
        }
        else
        {
            RunStatBlocksInfo(query, currStep, resultBlockIDs);
        }
    }